

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O0

bool __thiscall
dg::pta::LLVMPointerGraphBuilder::addFunctionToJoin
          (LLVMPointerGraphBuilder *this,PSNode *function,PSNodeJoin *joinNode)

{
  bool bVar1;
  PSNode *this_00;
  iterator this_01;
  reference ppPVar2;
  PSNode *in_RDX;
  long in_RSI;
  SubgraphNode<dg::pta::PSNode> *in_RDI;
  PSNode *ret_1;
  iterator __end4_1;
  iterator __begin4_1;
  set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
  *__range4_1;
  PSNode *ret;
  iterator __end4;
  iterator __begin4;
  set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_> *__range4
  ;
  PSNode *store;
  PSNode *phi;
  PointerSubgraph *subgraph;
  Function *F;
  PSNode *CInst;
  PSNode *in_stack_ffffffffffffff68;
  PSNode *in_stack_ffffffffffffff78;
  _Self in_stack_ffffffffffffff80;
  _Self in_stack_ffffffffffffff88;
  PSNodeJoin *in_stack_ffffffffffffff90;
  _Self local_60;
  _Self local_58;
  set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_> *local_50
  ;
  PSNode *local_48;
  PSNode *local_40;
  PSNode *local_38;
  PointerSubgraph *local_30;
  Function *local_28;
  PSNode *local_20;
  long local_10;
  
  local_10 = in_RSI;
  local_20 = PSNode::getPairedNode(in_RDX);
  PSNodeJoin::addFunction(in_stack_ffffffffffffff90,(PSNode *)in_stack_ffffffffffffff88._M_node);
  local_28 = SubgraphNode<dg::pta::PSNode>::getUserData<llvm::Function>
                       ((SubgraphNode<dg::pta::PSNode> *)(local_10 + 8));
  bVar1 = llvm::Function::empty((Function *)0x1bca43);
  if (!bVar1) {
    local_30 = getSubgraph((LLVMPointerGraphBuilder *)in_stack_ffffffffffffff88._M_node,
                           (Function *)in_stack_ffffffffffffff80._M_node);
    this_00 = SubgraphNode<dg::pta::PSNode>::getOperand(in_RDI,(size_t)in_stack_ffffffffffffff68);
    bVar1 = PSNode::isNull(this_00);
    if (bVar1) {
      std::set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
      ::begin((set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
               *)in_stack_ffffffffffffff68);
      this_01 = std::
                set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                ::end((set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                       *)in_stack_ffffffffffffff68);
      while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff88,
                                     (_Self *)&stack0xffffffffffffff80), bVar1) {
        ppPVar2 = std::_Rb_tree_const_iterator<dg::pta::PSNode_*>::operator*
                            ((_Rb_tree_const_iterator<dg::pta::PSNode_*> *)0x1bcbbd);
        SubgraphNode<dg::pta::PSNode>::addSuccessor
                  ((SubgraphNode<dg::pta::PSNode> *)this_01._M_node,*ppPVar2);
        std::_Rb_tree_const_iterator<dg::pta::PSNode_*>::operator++
                  ((_Rb_tree_const_iterator<dg::pta::PSNode_*> *)in_RDI);
      }
    }
    else {
      local_38 = PointerGraph::create<(dg::pta::PSNodeType)5>((PointerGraph *)in_RDI);
      local_48 = SubgraphNode<dg::pta::PSNode>::getOperand(in_RDI,(size_t)in_stack_ffffffffffffff68)
      ;
      local_40 = PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*>
                           ((PointerGraph *)in_stack_ffffffffffffff80._M_node,
                            (PSNode **)in_stack_ffffffffffffff78,(PSNode **)in_RDI);
      SubgraphNode<dg::pta::PSNode>::addSuccessor
                ((SubgraphNode<dg::pta::PSNode> *)in_stack_ffffffffffffff80._M_node,
                 in_stack_ffffffffffffff78);
      SubgraphNode<dg::pta::PSNode>::addSuccessor
                ((SubgraphNode<dg::pta::PSNode> *)in_stack_ffffffffffffff80._M_node,
                 in_stack_ffffffffffffff78);
      local_50 = &local_30->returnNodes;
      local_58._M_node =
           (_Base_ptr)
           std::
           set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
           ::begin((set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                    *)in_stack_ffffffffffffff68);
      local_60._M_node =
           (_Base_ptr)
           std::
           set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
           ::end((set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                  *)in_stack_ffffffffffffff68);
      while (bVar1 = std::operator!=(&local_58,&local_60), bVar1) {
        std::_Rb_tree_const_iterator<dg::pta::PSNode_*>::operator*
                  ((_Rb_tree_const_iterator<dg::pta::PSNode_*> *)0x1bcb36);
        SubgraphNode<dg::pta::PSNode>::addSuccessor
                  ((SubgraphNode<dg::pta::PSNode> *)in_stack_ffffffffffffff80._M_node,
                   in_stack_ffffffffffffff78);
        SubgraphNode<dg::pta::PSNode>::addOperand<dg::pta::PSNode*,dg::pta::PSNode>
                  (in_RDI,in_stack_ffffffffffffff68);
        std::_Rb_tree_const_iterator<dg::pta::PSNode_*>::operator++
                  ((_Rb_tree_const_iterator<dg::pta::PSNode_*> *)in_RDI);
      }
    }
  }
  return true;
}

Assistant:

bool LLVMPointerGraphBuilder::addFunctionToJoin(PSNode *function,
                                                PSNodeJoin *joinNode) {
    PSNode *CInst = joinNode->getPairedNode();
    joinNode->addFunction(function);
    const llvm::Function *F = function->getUserData<llvm::Function>();

    if (!F->empty()) {
        PointerSubgraph *subgraph = getSubgraph(F);
        assert(subgraph && "Did not build the subgraph for thread");

        DBG(pta, "Found a new join point for function '" << F->getName().str()
                                                         << "'");
        if (!CInst->getOperand(1)->isNull()) {
            PSNode *phi = PS.create<PSNodeType::PHI>();
            PSNode *store =
                    PS.create<PSNodeType::STORE>(phi, CInst->getOperand(1));
            phi->addSuccessor(store);
            store->addSuccessor(joinNode);
            for (PSNode *ret : subgraph->returnNodes) {
                ret->addSuccessor(phi);
                phi->addOperand(ret);
            }
        } else {
            for (PSNode *ret : subgraph->returnNodes) {
                ret->addSuccessor(joinNode);
            }
        }
    }
    return true;
}